

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O1

vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *
s2textformat::ParsePointsOrDie
          (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *__return_storage_ptr__,
          string_view str)

{
  bool bVar1;
  ostream *poVar2;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *in_RCX;
  size_type sVar3;
  string_view str_00;
  string_view piece;
  S2LogMessage SStack_38;
  
  piece.ptr_ = (char *)str.length_;
  (__return_storage_ptr__->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  str_00.length_ = (size_type)__return_storage_ptr__;
  str_00.ptr_ = piece.ptr_;
  bVar1 = ParsePoints((s2textformat *)str.ptr_,str_00,in_RCX);
  if (!bVar1) {
    sVar3 = 3;
    S2LogMessage::S2LogMessage
              (&SStack_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2text_format.cc"
               ,0x51,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_38.stream_,"Check failed: ParsePoints(str, &vertices) ",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>(SStack_38.stream_,": str == \"",10);
    piece.length_ = sVar3;
    poVar2 = absl::operator<<((absl *)SStack_38.stream_,(ostream *)str.ptr_,piece);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
    if (!bVar1) {
      abort();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<S2Point> ParsePointsOrDie(string_view str) {
  vector<S2Point> vertices;
  S2_CHECK(ParsePoints(str, &vertices)) << ": str == \"" << str << "\"";
  return vertices;
}